

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_map(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap_node *pNode;
  jx9_vm *pjVar1;
  void *pvVar2;
  uint uVar3;
  sxi32 sVar4;
  jx9_value *pSrc;
  undefined8 *puVar5;
  anon_union_8_3_18420de5_for_x *pVal;
  jx9_hashmap_node **ppjVar6;
  uint uVar7;
  jx9_value *pValue;
  anon_union_8_3_18420de5_for_x *local_d8;
  jx9_context *local_d0;
  undefined8 *local_c8;
  jx9_value **local_c0;
  anon_union_8_3_18420de5_for_x local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (((1 < nArg) && ((apArg[1]->iFlags & 0x40) != 0)) &&
     (pSrc = jx9_context_new_array(pCtx), pSrc != (jx9_value *)0x0)) {
    puVar5 = (undefined8 *)(apArg[1]->x).pOther;
    local_a8 = *puVar5;
    local_b8.rVal = 0.0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    uStack_b0 = 0x20;
    local_78.rVal = 0.0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_70 = 0x20;
    uVar3 = *(uint *)((long)puVar5 + 0x2c);
    local_d0 = pCtx;
    uStack_a0 = local_a8;
    local_68 = local_a8;
    uStack_60 = local_a8;
    if (uVar3 != 0) {
      ppjVar6 = (jx9_hashmap_node **)(puVar5 + 2);
      uVar7 = 0;
      local_c8 = puVar5;
      local_c0 = apArg;
      do {
        pNode = *ppjVar6;
        pjVar1 = pNode->pMap->pVm;
        if (pNode->nValIdx < (pjVar1->aMemObj).nUsed) {
          pvVar2 = (pjVar1->aMemObj).pBase;
          pVal = (anon_union_8_3_18420de5_for_x *)
                 ((ulong)(pNode->nValIdx * (pjVar1->aMemObj).eSize) + (long)pvVar2);
          local_d8 = pVal;
          if (pvVar2 != (void *)0x0) {
            sVar4 = jx9VmCallUserFunction
                              ((jx9_vm *)*puVar5,*apArg,1,(jx9_value **)&local_d8,
                               (jx9_value *)&local_b8);
            jx9HashmapExtractNodeKey(pNode,(jx9_value *)&local_78);
            if ((pSrc->iFlags & 0x40) != 0) {
              if (sVar4 == 0) {
                pVal = &local_b8;
              }
              HashmapInsert((jx9_hashmap *)(pSrc->x).pOther,(jx9_value *)&local_78,(jx9_value *)pVal
                           );
            }
            jx9MemObjRelease((jx9_value *)&local_78);
            jx9MemObjRelease((jx9_value *)&local_b8);
            uVar3 = *(uint *)((long)local_c8 + 0x2c);
            puVar5 = local_c8;
            apArg = local_c0;
          }
        }
        else {
          local_d8 = (anon_union_8_3_18420de5_for_x *)0x0;
        }
        ppjVar6 = &pNode->pPrev;
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar3);
    }
    jx9MemObjStore(pSrc,local_d0->pRet);
    return 0;
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int jx9_hashmap_map(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray, *pValue, sKey, sResult;
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pMap;
	sxu32 n;
	if( nArg < 2 || !jx9_value_is_json_array(apArg[1]) ){
		/* Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[1]->x.pOther;
	jx9MemObjInit(pMap->pVm, &sResult);
	jx9MemObjInit(pMap->pVm, &sKey);
	/* Perform the requested operation */
	pEntry = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extrcat the node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			sxi32 rc;
			/* Invoke the supplied callback */
			rc = jx9VmCallUserFunction(pMap->pVm, apArg[0], 1, &pValue, &sResult);
			/* Extract the node key */
			jx9HashmapExtractNodeKey(pEntry, &sKey);
			if( rc != SXRET_OK ){
				/* An error occured while invoking the supplied callback [i.e: not defined] */
				jx9_array_add_elem(pArray, &sKey, pValue); /* Keep the same value */
			}else{
				/* Insert the callback return value */
				jx9_array_add_elem(pArray, &sKey, &sResult);
			}
			jx9MemObjRelease(&sKey);
			jx9MemObjRelease(&sResult);
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}